

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall CoreTest_FormatTo_Test::~CoreTest_FormatTo_Test(CoreTest_FormatTo_Test *this)

{
  void *in_RDI;
  
  ~CoreTest_FormatTo_Test((CoreTest_FormatTo_Test *)0x12c808);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoreTest, FormatTo) {
  // This should work without including fmt/format.h.
#ifdef FMT_FORMAT_H_
# error fmt/format.h must not be included in the core test
#endif
  std::string s;
  fmt::format_to(std::back_inserter(s), "{}", 42);
  EXPECT_EQ(s, "42");
}